

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void SimpleLogger::setCrashDumpPath(string *path,bool origin_only)

{
  SimpleLoggerMgr *this;
  
  this = SimpleLoggerMgr::get();
  if (this != (SimpleLoggerMgr *)0x0) {
    SimpleLoggerMgr::setCrashDumpPath(this,path,origin_only);
    return;
  }
  return;
}

Assistant:

void SimpleLogger::setCrashDumpPath(const std::string& path,
                                    bool origin_only)
{
    SimpleLoggerMgr* mgr = SimpleLoggerMgr::get();
    if (mgr) {
        mgr->setCrashDumpPath(path, origin_only);
    }
}